

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragScalarN(char *label,ImGuiDataType data_type,void *p_data,int components,
                       float v_speed,void *p_min,void *p_max,char *format,float power)

{
  bool bVar1;
  undefined4 in_ECX;
  void *in_RDX;
  int in_ESI;
  void *in_RDI;
  long in_R8;
  long in_R9;
  undefined4 in_XMM0_Da;
  float in_XMM1_Da;
  ImGuiDataType unaff_retaddr;
  char *in_stack_00000008;
  ImGuiSliderFlags drag_flags;
  float in_stack_fffffffffffffff0;
  
  if ((in_XMM1_Da != 1.0) || (NAN(in_XMM1_Da))) {
    bVar1 = false;
    if ((in_XMM1_Da == 1.0) && (!NAN(in_XMM1_Da))) {
      bVar1 = true;
    }
    if (!bVar1) {
      __assert_fail("power == 1.0f && \"Call function with ImGuiSliderFlags_Logarithmic flags instead of using the old \'float power\' function!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_widgets.cpp"
                    ,0x9d8,
                    "bool ImGui::DragScalarN(const char *, ImGuiDataType, void *, int, float, const void *, const void *, const char *, float)"
                   );
    }
    if (in_R8 == 0 || in_R9 == 0) {
      __assert_fail("p_min != __null && p_max != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_widgets.cpp"
                    ,0x9d9,
                    "bool ImGui::DragScalarN(const char *, ImGuiDataType, void *, int, float, const void *, const void *, const char *, float)"
                   );
    }
  }
  bVar1 = DragScalarN(in_stack_00000008,unaff_retaddr,in_RDI,in_ESI,in_stack_fffffffffffffff0,in_RDX
                      ,(void *)CONCAT44(in_ECX,in_XMM0_Da),(char *)CONCAT44(power,drag_flags),
                      (ImGuiSliderFlags)p_max);
  return bVar1;
}

Assistant:

bool ImGui::DragScalarN(const char* label, ImGuiDataType data_type, void* p_data, int components, float v_speed, const void* p_min, const void* p_max, const char* format, float power)
{
    ImGuiSliderFlags drag_flags = ImGuiSliderFlags_None;
    if (power != 1.0f)
    {
        IM_ASSERT(power == 1.0f && "Call function with ImGuiSliderFlags_Logarithmic flags instead of using the old 'float power' function!");
        IM_ASSERT(p_min != NULL && p_max != NULL);  // When using a power curve the drag needs to have known bounds
        drag_flags |= ImGuiSliderFlags_Logarithmic;   // Fallback for non-asserting paths
    }
    return DragScalarN(label, data_type, p_data, components, v_speed, p_min, p_max, format, drag_flags);
}